

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select_node.cpp
# Opt level: O0

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformSelectInternal(Transformer *this,PGSelectStmt *stmt)

{
  int iVar1;
  PGList *pPVar2;
  bool bVar3;
  SelectNode *this_00;
  PGWindowDef *pPVar4;
  mapped_type *ppPVar5;
  undefined8 uVar6;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *in_RDX;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> in_RDI;
  SetOperationNode *result_1;
  optional_ptr<duckdb_libpgquery::PGNode,_true> target;
  templated_unique_single_t modifier;
  iterator it;
  string window_name;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_def;
  PGListCell *window_ele;
  SelectNode *result;
  StackChecker<duckdb::Transformer> stack_checker;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *node;
  key_type *in_stack_fffffffffffffbc8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
  *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined1 is_select;
  Transformer *in_stack_fffffffffffffbe0;
  optional_ptr<duckdb_libpgquery::PGNode,_true> in_stack_fffffffffffffbe8;
  allocator *paVar7;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_fffffffffffffc00;
  PGSetOperation params;
  string *in_stack_fffffffffffffc08;
  Transformer *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  Transformer *in_stack_fffffffffffffc38;
  ParserException *in_stack_fffffffffffffc40;
  PGList *in_stack_fffffffffffffc90;
  Transformer *in_stack_fffffffffffffc98;
  Transformer *in_stack_fffffffffffffcb0;
  optional_ptr<duckdb_libpgquery::PGList,_true> in_stack_fffffffffffffcb8;
  QueryNode *in_stack_fffffffffffffd10;
  PGSelectStmt *in_stack_fffffffffffffd18;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> in_stack_fffffffffffffd20;
  optional_ptr<duckdb_libpgquery::PGWithClause,_true> in_stack_fffffffffffffd38;
  optional_ptr<duckdb_libpgquery::PGList,_true> group;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [48];
  PGWithClause *local_1d8;
  SetOperationNode *local_1d0;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_1b8 [2];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_1a8 [2];
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_198;
  Transformer *in_stack_fffffffffffffe70;
  optional_ptr<duckdb_libpgquery::PGList,_true> in_stack_fffffffffffffe78;
  optional_ptr<duckdb_libpgquery::PGNode,_true> local_180 [2];
  optional_ptr<duckdb_libpgquery::PGList,_true> local_170 [2];
  optional_ptr<duckdb_libpgquery::PGList,_true> local_160 [2];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [56];
  undefined1 local_110 [8];
  PGListCell *local_108;
  undefined1 local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
  in_stack_ffffffffffffff60;
  PGWithClause *in_stack_ffffffffffffff68;
  Transformer *in_stack_ffffffffffffff70;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> local_70;
  long local_68;
  PGWithClause *local_60;
  SelectNode *local_58;
  undefined1 local_38 [32];
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *local_18;
  
  is_select = (undefined1)((ulong)in_stack_fffffffffffffbd8 >> 0x38);
  local_18 = in_RDX;
  StackCheck(in_stack_fffffffffffffc38,(idx_t)in_stack_fffffffffffffc30);
  local_38[0xf] = 0;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::unique_ptr
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)0xf31be9
            );
  iVar1 = *(int *)&local_18[0x12].
                   super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
                   .
                   super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                   .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  if (iVar1 == 0) {
    make_uniq<duckdb::SelectNode>();
    group.ptr = (PGList *)local_38;
    unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>::
    unique_ptr<duckdb::SelectNode,std::default_delete<std::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>>>,void>
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_> *)
               in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator=
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               0xf31c71);
    unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::~unique_ptr
              ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
               0xf31c7e);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0);
    this_00 = QueryNode::Cast<duckdb::SelectNode>((QueryNode *)in_stack_fffffffffffffc10);
    local_58 = this_00;
    if (local_18[0x11].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
      in_stack_fffffffffffffd38 =
           PGPointerCast<duckdb_libpgquery::PGWithClause>(in_stack_fffffffffffffbc8);
      local_60 = in_stack_fffffffffffffd38.ptr;
      optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)in_stack_fffffffffffffbd0);
      unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                 in_stack_fffffffffffffbd0);
      TransformCTE(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (CommonTableExpressionMap *)in_stack_ffffffffffffff60._M_cur);
    }
    if (local_18[8].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
      for (local_68 = *(long *)&(local_18[8].
                                 super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                 .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl)->
                                type; local_68 != 0; local_68 = *(long *)(local_68 + 8)) {
        in_stack_fffffffffffffd20 =
             PGPointerCast<duckdb_libpgquery::PGWindowDef>(in_stack_fffffffffffffbc8);
        local_70 = in_stack_fffffffffffffd20;
        in_stack_fffffffffffffd18 =
             (PGSelectStmt *)
             optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->
                       ((optional_ptr<duckdb_libpgquery::PGWindowDef,_true> *)
                        in_stack_fffffffffffffbd0);
        pPVar2 = in_stack_fffffffffffffd18->distinctClause;
        in_stack_fffffffffffffd10 = (QueryNode *)&stack0xffffffffffffff6f;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff70,(char *)pPVar2,
                   (allocator *)in_stack_fffffffffffffd10);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
        ::std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
        ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
                *)in_stack_fffffffffffffbc8,(key_type *)0xf31e55);
        local_a8._M_cur =
             (__node_type *)
             ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
                    *)in_stack_fffffffffffffbc8);
        bVar3 = ::std::__detail::operator!=
                          ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                            *)&stack0xffffffffffffff60,&local_a8);
        if (bVar3) {
          local_f1 = 1;
          uVar6 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_c8,"window \"%s\" is already defined",&local_c9);
          ::std::__cxx11::string::string(local_f0,(string *)&stack0xffffffffffffff70);
          ParserException::ParserException<std::__cxx11::string>
                    (in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38,
                     in_stack_fffffffffffffc30);
          local_f1 = 0;
          __cxa_throw(uVar6,&ParserException::typeinfo,ParserException::~ParserException);
        }
        pPVar4 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::get(&local_70);
        ppPVar5 = ::std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
                  ::operator[](in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        *ppPVar5 = pPVar4;
        ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
      }
    }
    if (local_18[1].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
      make_uniq<duckdb::DistinctModifier>();
      local_108 = (PGListCell *)PGPointerCast<duckdb_libpgquery::PGNode>(in_stack_fffffffffffffbc8);
      bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_108);
      if (bVar3) {
        unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>::
        operator->((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                    *)in_stack_fffffffffffffbd0);
        TransformExpressionList
                  (in_stack_fffffffffffffc10,(PGList *)in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00);
      }
      in_stack_fffffffffffffcb0 = (Transformer *)&(local_58->super_QueryNode).modifiers;
      in_stack_fffffffffffffcb8.ptr = (PGList *)local_110;
      unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>::
      unique_ptr<duckdb::DistinctModifier,std::default_delete<std::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>>>,void>
                ((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                  *)in_stack_fffffffffffffbd0,
                 (unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>_>
                  *)in_stack_fffffffffffffbc8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   *)in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
      unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                   *)0xf321ce);
      unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>::
      ~unique_ptr((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                   *)0xf321db);
    }
    if (local_18[10].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) {
      if (local_18[3].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
          _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
          _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
          super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) {
        local_14a = 1;
        uVar6 = __cxa_allocate_exception(0x10);
        paVar7 = &local_149;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_148,"SELECT clause without selection list",paVar7);
        ParserException::ParserException
                  ((ParserException *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8)
        ;
        local_14a = 0;
        __cxa_throw(uVar6,&ParserException::typeinfo,ParserException::~ParserException);
      }
      if ((*(byte *)((long)&local_18[0x12].
                            super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                            .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl + 5) & 1
          ) == 0) {
        TransformExpressionList
                  (in_stack_fffffffffffffc10,(PGList *)in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00);
        optional_ptr<duckdb_libpgquery::PGList,_true>::optional_ptr
                  (local_170,
                   (PGList *)
                   local_18[4].
                   super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
                   .
                   super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                   .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
        TransformFrom(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   in_stack_fffffffffffffbd0,
                   (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   in_stack_fffffffffffffbc8);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   0xf32557);
      }
      else {
        optional_ptr<duckdb_libpgquery::PGList,_true>::optional_ptr
                  (local_160,
                   (PGList *)
                   local_18[4].
                   super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
                   .
                   super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                   .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
        TransformFrom(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   in_stack_fffffffffffffbd0,
                   (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   in_stack_fffffffffffffbc8);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   0xf324a1);
        TransformExpressionList
                  (in_stack_fffffffffffffc10,(PGList *)in_stack_fffffffffffffc08,
                   in_stack_fffffffffffffc00);
      }
    }
    else {
      TransformValuesList(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator=
                ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                 in_stack_fffffffffffffbd0,
                 (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                 in_stack_fffffffffffffbc8);
      unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::~unique_ptr
                ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                 0xf32277);
      make_uniq<duckdb::StarExpression>();
      unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
      unique_ptr<duckdb::StarExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffbd0,
                 (unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>_> *
                 )in_stack_fffffffffffffbc8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0xf322db);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                   *)0xf322e8);
    }
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (local_180,
               (PGNode *)
               local_18[5].
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    TransformExpression(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbd0,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0xf325c4);
    optional_ptr<duckdb_libpgquery::PGList,_true>::optional_ptr
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)&stack0xfffffffffffffe78,
               (PGList *)
               local_18[6].
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    TransformGroupBy((Transformer *)this_00,group,(SelectNode *)in_stack_fffffffffffffd38.ptr);
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (&local_198,
               (PGNode *)
               local_18[7].
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    TransformExpression(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbd0,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0xf32669);
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (local_1a8,
               (PGNode *)
               local_18[9].
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    TransformExpression(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator=((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbd0,
              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               *)in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0xf326d4);
    optional_ptr<duckdb_libpgquery::PGNode,_true>::optional_ptr
              (local_1b8,
               (PGNode *)
               local_18[0xf].
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
    TransformSampleOptions
              (in_stack_fffffffffffffe70,
               (optional_ptr<duckdb_libpgquery::PGNode,_true>)in_stack_fffffffffffffe78.ptr);
    unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::operator=
              ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::~unique_ptr
              ((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)0xf32737);
  }
  else {
    if (3 < iVar1 - 1U) {
      uVar6 = __cxa_allocate_exception(0x10);
      params = (PGSetOperation)((ulong)in_stack_fffffffffffffc00 >> 0x20);
      paVar7 = &local_281;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,"Statement type %d not implemented!",paVar7);
      NotImplementedException::NotImplementedException<duckdb_libpgquery::PGSetOperation>
                ((NotImplementedException *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                 params);
      __cxa_throw(uVar6,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    make_uniq<duckdb::SetOperationNode>();
    unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>::
    unique_ptr<duckdb::SetOperationNode,std::default_delete<std::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>>>,void>
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>_>
                *)in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator=
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               0xf32792);
    unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
                 *)0xf3279f);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0);
    local_1d0 = QueryNode::Cast<duckdb::SetOperationNode>((QueryNode *)in_stack_fffffffffffffc10);
    if (local_18[0x11].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
      local_1d8 = (PGWithClause *)
                  PGPointerCast<duckdb_libpgquery::PGWithClause>(in_stack_fffffffffffffbc8);
      optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)in_stack_fffffffffffffbd0);
      unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                 in_stack_fffffffffffffbd0);
      TransformCTE(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (CommonTableExpressionMap *)in_stack_ffffffffffffff60._M_cur);
    }
    TransformSelectNode((Transformer *)in_stack_fffffffffffffbe8.ptr,
                        (PGNode *)in_stack_fffffffffffffbe0,(bool)is_select);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator=
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               0xf328b1);
    TransformSelectNode((Transformer *)in_stack_fffffffffffffbe8.ptr,
                        (PGNode *)in_stack_fffffffffffffbe0,(bool)is_select);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator=
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbd0,
               (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               in_stack_fffffffffffffbc8);
    unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
               0xf32905);
    bVar3 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
                       0xf32919);
    if ((!bVar3) ||
       (bVar3 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *
                           )0xf32933), !bVar3)) {
      local_20a = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_208,"Failed to transform setop children.",&local_209);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8)
      ;
      local_20a = 0;
      __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_1d0->setop_all =
         (bool)(*(byte *)((long)&local_18[0x12].
                                 super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                 ._M_t.
                                 super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                 .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl + 4
                         ) & 1);
    switch(*(undefined4 *)
            &local_18[0x12].
             super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
             super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl) {
    case 1:
      local_1d0->setop_type = UNION;
      break;
    case 2:
      local_1d0->setop_type = INTERSECT;
      break;
    case 3:
      local_1d0->setop_type = EXCEPT;
      break;
    case 4:
      local_1d0->setop_type = UNION_BY_NAME;
      break;
    default:
      local_232 = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      paVar7 = &local_231;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_230,"Unexpected setop type",paVar7);
      InternalException::InternalException
                ((InternalException *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8)
      ;
      local_232 = 0;
      __cxa_throw(uVar6,&InternalException::typeinfo,InternalException::~InternalException);
    }
    if (local_18[0xf].super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
      local_25a = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_258,"SAMPLE clause is only allowed in regular SELECT statements",&local_259);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8);
      local_25a = 0;
      __cxa_throw(uVar6,&ParserException::typeinfo,ParserException::~ParserException);
    }
  }
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*(local_18);
  TransformModifiers((Transformer *)in_stack_fffffffffffffd20.ptr,in_stack_fffffffffffffd18,
                     in_stack_fffffffffffffd10);
  local_38[0xf] = 1;
  StackChecker<duckdb::Transformer>::~StackChecker
            ((StackChecker<duckdb::Transformer> *)(local_38 + 0x10));
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformSelectInternal(duckdb_libpgquery::PGSelectStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGSelectStmt);
	auto stack_checker = StackCheck();

	unique_ptr<QueryNode> node;

	switch (stmt.op) {
	case duckdb_libpgquery::PG_SETOP_NONE: {
		node = make_uniq<SelectNode>();
		auto &result = node->Cast<SelectNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		if (stmt.windowClause) {
			for (auto window_ele = stmt.windowClause->head; window_ele != nullptr; window_ele = window_ele->next) {
				auto window_def = PGPointerCast<duckdb_libpgquery::PGWindowDef>(window_ele->data.ptr_value);
				D_ASSERT(window_def);
				D_ASSERT(window_def->name);
				string window_name(window_def->name);
				auto it = window_clauses.find(window_name);
				if (it != window_clauses.end()) {
					throw ParserException("window \"%s\" is already defined", window_name);
				}
				window_clauses[window_name] = window_def.get();
			}
		}

		// checks distinct clause
		if (stmt.distinctClause != nullptr) {
			auto modifier = make_uniq<DistinctModifier>();
			// checks distinct on clause
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(stmt.distinctClause->head->data.ptr_value);
			if (target) {
				//  add the columns defined in the ON clause to the select list
				TransformExpressionList(*stmt.distinctClause, modifier->distinct_on_targets);
			}
			result.modifiers.push_back(std::move(modifier));
		}

		// do this early so the value lists also have a `FROM`
		if (stmt.valuesLists) {
			// VALUES list, create an ExpressionList
			D_ASSERT(!stmt.fromClause);
			result.from_table = TransformValuesList(stmt.valuesLists);
			result.select_list.push_back(make_uniq<StarExpression>());
		} else {
			if (!stmt.targetList) {
				throw ParserException("SELECT clause without selection list");
			}
			// transform in the specified order to ensure positional parameters are correctly set
			if (stmt.from_first) {
				result.from_table = TransformFrom(stmt.fromClause);
				TransformExpressionList(*stmt.targetList, result.select_list);
			} else {
				TransformExpressionList(*stmt.targetList, result.select_list);
				result.from_table = TransformFrom(stmt.fromClause);
			}
		}

		// where
		result.where_clause = TransformExpression(stmt.whereClause);
		// group by
		TransformGroupBy(stmt.groupClause, result);
		// having
		result.having = TransformExpression(stmt.havingClause);
		// qualify
		result.qualify = TransformExpression(stmt.qualifyClause);
		// sample
		result.sample = TransformSampleOptions(stmt.sampleOptions);
		break;
	}
	case duckdb_libpgquery::PG_SETOP_UNION:
	case duckdb_libpgquery::PG_SETOP_EXCEPT:
	case duckdb_libpgquery::PG_SETOP_INTERSECT:
	case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME: {
		node = make_uniq<SetOperationNode>();
		auto &result = node->Cast<SetOperationNode>();
		if (stmt.withClause) {
			TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(stmt.withClause), node->cte_map);
		}
		result.left = TransformSelectNode(*stmt.larg);
		result.right = TransformSelectNode(*stmt.rarg);
		if (!result.left || !result.right) {
			throw InternalException("Failed to transform setop children.");
		}

		result.setop_all = stmt.all;
		switch (stmt.op) {
		case duckdb_libpgquery::PG_SETOP_UNION:
			result.setop_type = SetOperationType::UNION;
			break;
		case duckdb_libpgquery::PG_SETOP_EXCEPT:
			result.setop_type = SetOperationType::EXCEPT;
			break;
		case duckdb_libpgquery::PG_SETOP_INTERSECT:
			result.setop_type = SetOperationType::INTERSECT;
			break;
		case duckdb_libpgquery::PG_SETOP_UNION_BY_NAME:
			result.setop_type = SetOperationType::UNION_BY_NAME;
			break;
		default:
			throw InternalException("Unexpected setop type");
		}
		if (stmt.sampleOptions) {
			throw ParserException("SAMPLE clause is only allowed in regular SELECT statements");
		}
		break;
	}
	default:
		throw NotImplementedException("Statement type %d not implemented!", stmt.op);
	}

	TransformModifiers(stmt, *node);

	return node;
}